

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O0

void Abc_AttachComputeTruth(char *pSop,uint (*uTruthsIn) [2],uint *uTruthRes)

{
  int iVar1;
  bool bVar2;
  int local_44;
  char *pcStack_40;
  int k;
  char *pCube;
  int nFanins;
  int nInputs;
  int Value;
  uint uSignCube [2];
  uint *uTruthRes_local;
  uint (*uTruthsIn_local) [2];
  char *pSop_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  *uTruthRes = 0;
  uTruthRes[1] = 0;
  for (pcStack_40 = pSop; *pcStack_40 != '\0'; pcStack_40 = pcStack_40 + (iVar1 + 3)) {
    nInputs = -1;
    Value = -1;
    local_44 = 0;
    while( true ) {
      bVar2 = false;
      if (pcStack_40[local_44] != ' ') {
        nFanins = (int)pcStack_40[local_44];
        bVar2 = nFanins != 0;
      }
      if (!bVar2) break;
      if (nFanins == 0x30) {
        nInputs = (uTruthsIn[local_44][0] ^ 0xffffffff) & nInputs;
        Value = (uTruthsIn[local_44][1] ^ 0xffffffff) & Value;
      }
      else if (nFanins == 0x31) {
        nInputs = uTruthsIn[local_44][0] & nInputs;
        Value = uTruthsIn[local_44][1] & Value;
      }
      local_44 = local_44 + 1;
    }
    *uTruthRes = nInputs | *uTruthRes;
    uTruthRes[1] = Value | uTruthRes[1];
  }
  iVar1 = Abc_SopGetPhase(pSop);
  if (iVar1 == 0) {
    *uTruthRes = *uTruthRes ^ 0xffffffff;
    uTruthRes[1] = uTruthRes[1] ^ 0xffffffff;
  }
  return;
}

Assistant:

void Abc_AttachComputeTruth( char * pSop, unsigned uTruthsIn[][2], unsigned * uTruthRes )
{
//    Mvc_Cube_t * pCube;
    unsigned uSignCube[2];
    int Value;
//    int nInputs = pCover->nBits/2;
    int nInputs = 6;
    int nFanins = Abc_SopGetVarNum(pSop);
    char * pCube;
    int k;

    // make sure that the number of input truth tables in equal to the number of gate inputs
    assert( nInputs < 7 );

    // clean the resulting truth table
    uTruthRes[0] = 0;
    uTruthRes[1] = 0;
    if ( nInputs < 6 )
    {
        // consider the case when only one unsigned can be used
//        Mvc_CoverForEachCube( pCover, pCube )
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            uSignCube[0] = ATTACH_FULL;
//            Mvc_CubeForEachVarValue( pCover, pCube, Var, Value )
            Abc_CubeForEachVar( pCube, Value, k )
            {
                if ( Value == '0' )
                    uSignCube[0] &= ~uTruthsIn[k][0];
                else if ( Value == '1' )
                    uSignCube[0] &=  uTruthsIn[k][0];
            }
            uTruthRes[0] |= uSignCube[0];
        }
        if ( Abc_SopGetPhase(pSop) == 0 )
            uTruthRes[0] = ~uTruthRes[0];
        if ( nInputs < 5 )
            uTruthRes[0] &= ATTACH_MASK(1<<nInputs);
    }
    else
    {
        // consider the case when two unsigneds should be used
//        Mvc_CoverForEachCube( pCover, pCube )
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            uSignCube[0] = ATTACH_FULL;
            uSignCube[1] = ATTACH_FULL;
//            Mvc_CubeForEachVarValue( pCover, pCube, Var, Value )
            Abc_CubeForEachVar( pCube, Value, k )
            {
                if ( Value == '0' )
                {
                    uSignCube[0] &= ~uTruthsIn[k][0];
                    uSignCube[1] &= ~uTruthsIn[k][1];
                }
                else if ( Value == '1' )
                {
                    uSignCube[0] &=  uTruthsIn[k][0];
                    uSignCube[1] &=  uTruthsIn[k][1];
                }
            }
            uTruthRes[0] |= uSignCube[0];
            uTruthRes[1] |= uSignCube[1];
        }

        // complement if the SOP is complemented
        if ( Abc_SopGetPhase(pSop) == 0 )
        {
            uTruthRes[0] = ~uTruthRes[0];
            uTruthRes[1] = ~uTruthRes[1];
        }
    }
}